

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O0

DefaultFormatter * __thiscall
cppassert::DefaultFormatter::formatBoolFailureMessage_abi_cxx11_
          (DefaultFormatter *this,char *expressionText,char *actualPredicateValue,
          char *expectedPredicateValue)

{
  AssertionMessage *pAVar1;
  AssertionMessage local_38;
  AssertionMessage msg;
  char *expectedPredicateValue_local;
  char *actualPredicateValue_local;
  char *expressionText_local;
  DefaultFormatter *this_local;
  
  expectedPredicateValue_local = expectedPredicateValue;
  actualPredicateValue_local = actualPredicateValue;
  expressionText_local = expressionText;
  this_local = this;
  internal::AssertionMessage::AssertionMessage(&local_38);
  pAVar1 = internal::AssertionMessage::operator<<
                     (&local_38,(char (*) [29])"Assertion failure value of: ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&actualPredicateValue_local);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char (*) [12])"\n  Actual: ");
  internal::AssertionMessage::operator<<(pAVar1,&expectedPredicateValue_local);
  pAVar1 = internal::AssertionMessage::operator<<(&local_38,(char (*) [12])"\nExpected: ");
  internal::AssertionMessage::operator<<(pAVar1,(char **)&msg);
  internal::AssertionMessage::str_abi_cxx11_((AssertionMessage *)this);
  internal::AssertionMessage::~AssertionMessage(&local_38);
  return this;
}

Assistant:

std::string DefaultFormatter::formatBoolFailureMessage(const char* expressionText,
                                    const char* actualPredicateValue,
                                    const char* expectedPredicateValue)
{
    AssertionMessage msg;
    msg << "Assertion failure value of: " << expressionText
        << "\n  Actual: " << actualPredicateValue;
    msg << "\nExpected: " << expectedPredicateValue;
    return msg.str();
}